

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes ReadTime(CSzBitUi64s *p,UInt32 num,CSzData *sd2,CBuf *tempBufs,UInt32 numTempBufs,
             ISzAlloc *alloc)

{
  Byte BVar1;
  Byte *pBVar2;
  bool bVar3;
  SRes SVar4;
  CNtfsFileTime *pCVar5;
  ulong uVar6;
  size_t sVar7;
  UInt32 *pUVar8;
  UInt32 index;
  uint local_3c;
  CBuf *local_38;
  
  local_38 = tempBufs;
  SVar4 = ReadBitVector(sd2,num,&p->Defs,(ISzAlloc *)tempBufs);
  if (SVar4 != 0) {
    return SVar4;
  }
  if (sd2->Size == 0) {
    return 0x10;
  }
  sVar7 = sd2->Size - 1;
  sd2->Size = sVar7;
  pBVar2 = sd2->Data;
  pUVar8 = (UInt32 *)(pBVar2 + 1);
  sd2->Data = (Byte *)pUVar8;
  BVar1 = *pBVar2;
  if (BVar1 == '\0') goto LAB_00114f38;
  SVar4 = SzReadNumber32(sd2,&local_3c);
  if (SVar4 == 0) {
    if (numTempBufs <= local_3c) {
      SVar4 = 0x10;
      goto LAB_00114f2e;
    }
    pUVar8 = (UInt32 *)local_38[local_3c].data;
    sVar7 = local_38[local_3c].size;
    bVar3 = true;
    SVar4 = 0;
  }
  else {
LAB_00114f2e:
    bVar3 = false;
  }
  if (!bVar3) {
    return SVar4;
  }
LAB_00114f38:
  if (num == 0) {
    p->Vals = (CNtfsFileTime *)0x0;
  }
  else {
    pCVar5 = (CNtfsFileTime *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)num * 8);
    p->Vals = pCVar5;
    if (pCVar5 == (CNtfsFileTime *)0x0) {
      return 2;
    }
  }
  if (num != 0) {
    pBVar2 = p->Defs;
    pCVar5 = p->Vals;
    uVar6 = 0;
    do {
      if ((char)(pBVar2[uVar6 >> 3 & 0x1fffffff] << ((byte)uVar6 & 7)) < '\0') {
        if (sVar7 < 8) {
          return 0x10;
        }
        pCVar5[uVar6].Low = *pUVar8;
        pCVar5[uVar6].High = pUVar8[1];
        sVar7 = sVar7 - 8;
        pUVar8 = pUVar8 + 2;
      }
      else {
        pCVar5[uVar6].Low = 0;
        pCVar5[uVar6].High = 0;
      }
      uVar6 = uVar6 + 1;
    } while (num != uVar6);
  }
  if (BVar1 == '\0') {
    sd2->Data = (Byte *)pUVar8;
    sd2->Size = sVar7;
  }
  return 0;
}

Assistant:

static MY_NO_INLINE SRes ReadTime(CSzBitUi64s *p, UInt32 num,
    CSzData *sd2,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  UInt32 i;
  CNtfsFileTime *vals;
  Byte *defs;
  Byte external;
  
  RINOK(ReadBitVector(sd2, num, &p->Defs, alloc));
  
  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC_ZE(CNtfsFileTime, p->Vals, num, alloc);
  vals = p->Vals;
  defs = p->Defs;
  for (i = 0; i < num; i++)
    if (SzBitArray_Check(defs, i))
    {
      if (sd.Size < 8)
        return SZ_ERROR_ARCHIVE;
      vals[i].Low = GetUi32(sd.Data);
      vals[i].High = GetUi32(sd.Data + 4);
      SKIP_DATA2(sd, 8);
    }
    else
      vals[i].High = vals[i].Low = 0;
  
  if (external == 0)
    *sd2 = sd;
  
  return SZ_OK;
}